

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::Parser::ParseChunk
          (Parser *this,StringPiece chunk,string *out_error)

{
  string *str;
  char *pcVar1;
  size_type sVar2;
  bool bVar3;
  int iVar4;
  StringPiece line;
  StringPiece local_88;
  StringPiece local_78;
  StringPiece local_68;
  string local_50;
  
  local_78.length_ = chunk.length_;
  local_78.ptr_ = chunk.ptr_;
  local_88.ptr_ = (char *)0x0;
  local_88.length_ = 0;
  str = &this->leftover_;
  pcVar1 = local_78.ptr_;
  sVar2 = local_78.length_;
  if ((this->leftover_)._M_string_length != 0) {
    stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_50,&local_78);
    std::__cxx11::string::append((string *)str);
    std::__cxx11::string::~string((string *)&local_50);
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_88,str);
    pcVar1 = local_88.ptr_;
    sVar2 = local_88.length_;
  }
  local_88.length_ = sVar2;
  local_88.ptr_ = pcVar1;
  local_68.ptr_ = (char *)0x0;
  local_68.length_ = 0;
  do {
    bVar3 = ReadLine(&local_88,&local_68);
    if (!bVar3) {
      if (local_88.length_ == 0) goto LAB_002b0e17;
      stringpiece_internal::StringPiece::ToString_abi_cxx11_(&local_50,&local_88);
      std::__cxx11::string::operator=((string *)str,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_002b0e23;
    }
    this->line_ = this->line_ + 1;
    RemoveComment(&local_68);
    TrimWhitespace(&local_68);
  } while ((local_68.length_ == 0) ||
          (iVar4 = (*this->line_consumer_->_vptr_LineConsumer[2])
                             (this->line_consumer_,&local_68,out_error), (char)iVar4 != '\0'));
  if (out_error->_M_string_length == 0) {
    std::__cxx11::string::assign((char *)out_error);
  }
LAB_002b0e17:
  (this->leftover_)._M_string_length = 0;
  *(this->leftover_)._M_dataplus._M_p = '\0';
LAB_002b0e23:
  return !bVar3;
}

Assistant:

bool Parser::ParseChunk(StringPiece chunk, std::string* out_error) {
  StringPiece full_chunk;
  if (!leftover_.empty()) {
    leftover_ += std::string(chunk);
    full_chunk = StringPiece(leftover_);
  } else {
    full_chunk = chunk;
  }

  StringPiece line;
  while (ReadLine(&full_chunk, &line)) {
    ++line_;
    RemoveComment(&line);
    TrimWhitespace(&line);
    if (!line.empty() && !line_consumer_->ConsumeLine(line, out_error)) {
      if (out_error->empty()) {
        *out_error = "ConsumeLine failed without setting an error.";
      }
      leftover_.clear();
      return false;
    }
  }

  if (full_chunk.empty()) {
    leftover_.clear();
  } else {
    leftover_ = std::string(full_chunk);
  }
  return true;
}